

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectoryReader.cpp
# Opt level: O1

string * phpconvert::DirectoryReader::getDirectorySeparator_abi_cxx11_(void)

{
  string *in_RDI;
  
  getOS();
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)in_RDI);
  return in_RDI;
}

Assistant:

string DirectoryReader::getDirectorySeparator() { //cache it
        OS os = getOS();
        string separator; //make it static

        if (os == Win) {
            separator = NIX_DS;
        } else if (os == Nix) {
            separator = NIX_DS;
        }
        return separator;
    }